

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O0

void __thiscall kratos::IfStmt::IfStmt(IfStmt *this,shared_ptr<kratos::Var> *predicate)

{
  uint32_t width;
  int iVar1;
  element_type *peVar2;
  element_type *peVar3;
  element_type *peVar4;
  undefined1 local_68 [16];
  undefined1 local_58 [48];
  shared_ptr<kratos::ScopedStmtBlock> local_28;
  undefined8 local_18;
  shared_ptr<kratos::Var> *predicate_local;
  IfStmt *this_local;
  
  local_18 = predicate;
  predicate_local = (shared_ptr<kratos::Var> *)this;
  Stmt::Stmt(&this->super_Stmt,If);
  (this->super_Stmt).super_IRNode._vptr_IRNode = (_func_int **)&PTR_accept_005a02f0;
  std::shared_ptr<kratos::Var>::shared_ptr(&this->predicate_,predicate);
  std::shared_ptr<kratos::AssignStmt>::shared_ptr(&this->predicate_stmt_);
  std::shared_ptr<kratos::ScopedStmtBlock>::shared_ptr(&this->then_body_);
  std::shared_ptr<kratos::ScopedStmtBlock>::shared_ptr(&this->else_body_);
  std::make_shared<kratos::ScopedStmtBlock>();
  std::shared_ptr<kratos::ScopedStmtBlock>::operator=(&this->then_body_,&local_28);
  std::shared_ptr<kratos::ScopedStmtBlock>::~shared_ptr(&local_28);
  std::make_shared<kratos::ScopedStmtBlock>();
  std::shared_ptr<kratos::ScopedStmtBlock>::operator=
            (&this->else_body_,(shared_ptr<kratos::ScopedStmtBlock> *)(local_58 + 0x10));
  std::shared_ptr<kratos::ScopedStmtBlock>::~shared_ptr
            ((shared_ptr<kratos::ScopedStmtBlock> *)(local_58 + 0x10));
  peVar2 = std::
           __shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->then_body_);
  (*(peVar2->super_StmtBlock).super_Stmt.super_IRNode._vptr_IRNode[7])(peVar2,this);
  peVar2 = std::
           __shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->else_body_);
  (*(peVar2->super_StmtBlock).super_Stmt.super_IRNode._vptr_IRNode[7])(peVar2,this);
  peVar3 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->predicate_);
  width = (*(peVar3->super_IRNode)._vptr_IRNode[0xd])();
  peVar3 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->predicate_);
  iVar1 = (*(peVar3->super_IRNode)._vptr_IRNode[7])();
  Generator::get_auxiliary_var((Generator *)local_68,width,SUB41(iVar1,0));
  peVar3 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_68);
  Var::assign((Var *)local_58,(shared_ptr<kratos::Var> *)peVar3);
  std::shared_ptr<kratos::AssignStmt>::operator=
            (&this->predicate_stmt_,(shared_ptr<kratos::AssignStmt> *)local_58);
  std::shared_ptr<kratos::AssignStmt>::~shared_ptr((shared_ptr<kratos::AssignStmt> *)local_58);
  std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)local_68);
  peVar4 = std::__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->predicate_stmt_);
  (*(peVar4->super_Stmt).super_IRNode._vptr_IRNode[7])(peVar4,this);
  return;
}

Assistant:

IfStmt::IfStmt(std::shared_ptr<Var> predicate)
    : Stmt(StatementType::If), predicate_(::move(predicate)) {
    then_body_ = std::make_shared<ScopedStmtBlock>();
    else_body_ = std::make_shared<ScopedStmtBlock>();

    then_body_->set_parent(this);
    else_body_->set_parent(this);

    // just to add the sinks
    predicate_stmt_ =
        predicate_->generator()->get_auxiliary_var(predicate_->width())->assign(predicate_);
    predicate_stmt_->set_parent(this);
}